

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O3

void __thiscall crail::Filename::Filename(Filename *this,string *name)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int local_40 [2];
  long local_38;
  
  (this->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_Write_00131980;
  (this->name_)._M_dataplus._M_p = (char *)std::string::insert;
  local_40[0] = 1;
  if (*(ulong *)((name->_M_dataplus)._M_p + -0x18) < 2) {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    do {
      iVar1 = file_hash(name,local_40);
      lVar2 = (long)local_40[0];
      this->components_[lVar3] = iVar1;
      lVar3 = lVar3 + 1;
      local_40[0] = (int)(lVar2 + 1U);
    } while (lVar2 + 1U < *(ulong *)((name->_M_dataplus)._M_p + -0x18));
  }
  this->length_ = (int)lVar3;
  std::string::substr((ulong)&local_38,(ulong)name);
  std::string::swap(&this->name_);
  std::string::_Rep::_M_dispose((allocator *)(local_38 + -0x18));
  return;
}

Assistant:

Filename::Filename(string &name) {
  int index_name = 1;
  int index_comp = 0;
  int name_start = index_name;
  int name_stop = name_start;
  while (index_name < name.length()) {
    name_start = index_name;
    int hash_code = file_hash(name, index_name);
    name_stop = index_name - 1;
    components_[index_comp] = hash_code;
    index_comp++;
    index_name++;
  }
  this->length_ = index_comp;
  this->name_ = name.substr(name_start, name_stop - name_start + 1);

  /*
char slash = '/';
int start_index = 1;
std::string::size_type pos = name.find(&slash, start_index);
int index = 0;
while (pos != std::string::npos) {
int hash_code = 0;
for (uint32_t i = start_index; i < pos; i++) {
hash_code = 31 * hash_code + name[i];
}
components_[index] = hash_code;
index++;
start_index = pos + 1;
}
if (start_index < name.length()) {
int hash_code = 0;
for (uint32_t i = start_index; i < name.length(); i++) {
hash_code = 31 * hash_code + name[i];
}
components_[index] = hash_code;
index++;
}
length_ = index;
while (index < kDirectoryDepth) {
components_[index] = 0;
index++;
}
  */

  /*
std::string token;
std::stringstream tokenStream(name);
int index = 0;
while (std::getline(tokenStream, token, '/')) {
if (token.empty()) {
continue;
}
components_[index] = file_hash(token);
name_ = token;
index++;
}
length_ = index;
while (index < kDirectoryDepth) {
components_[index] = 0;
index++;
}
  */
}